

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initdsp.c
# Opt level: O2

void flush_display_lineregion(UNSIGNED x,DLword *ybase,int w,int h)

{
  undefined1 auVar1 [16];
  
  auVar1._8_8_ = (long)ybase - (long)DisplayRegion68k >> 0x3f;
  auVar1._0_8_ = (long)ybase - (long)DisplayRegion68k >> 1;
  (*currentdsp->bitblt_to_screen)
            (currentdsp,DisplayRegion68k,(int)x,
             SUB164(auVar1 / SEXT816((long)(ulong)(displaywidth >> 4)),0),w,h);
  return;
}

Assistant:

void flush_display_lineregion(UNSIGNED x, DLword *ybase, int w, int h)
{
  int y;
  y = ((DLword *)ybase - DisplayRegion68k) / DLWORD_PERLINE;
  //  printf("flush_display_lineregion %d %d %d %d\n", x, y, w, h);
#ifdef SDL
  sdl_notify_damage(x, y, w, h);
#endif
#if (defined(XWINDOW) || defined(DOS))
  TPRINT(("Enter flush_display_lineregion x=%p, y=%d, w=%d, h=%d\n", (void *)x, y, w, h));
  (currentdsp->bitblt_to_screen)(currentdsp, DisplayRegion68k, x, y, w, h);
  TPRINT(("Exit flush_display_lineregion\n"));
#endif /* DOS */
}